

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void perlin_spheres(void)

{
  shared_ptr<noise_texture> pertext;
  undefined1 local_23c [12];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_230;
  int local_228 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_220;
  undefined1 local_218 [24];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  shared_ptr<hittable> local_1b8;
  shared_ptr<hittable> local_1a8;
  camera local_198;
  
  local_218._16_8_ = &PTR__hittable_list_001253d8;
  local_1f0 = 0;
  local_200 = 0;
  uStack_1f8 = 0;
  local_1e8 = 0x7ff0000000000000;
  uStack_1e0 = 0xfff0000000000000;
  local_1d8 = 0x7ff0000000000000;
  uStack_1d0 = 0xfff0000000000000;
  local_1c8 = 0x7ff0000000000000;
  uStack_1c0 = 0xfff0000000000000;
  local_198.aspect_ratio = (double)CONCAT44(local_198.aspect_ratio._4_4_,4);
  std::make_shared<noise_texture,int>(local_228);
  local_198.aspect_ratio = 0.0;
  local_198.image_width = 0;
  local_198.samples_per_pixel = -0x3f70c000;
  local_198.max_depth = 0;
  local_198._20_4_ = 0;
  local_23c._0_4_ = 1000;
  std::make_shared<lambertian,std::shared_ptr<noise_texture>&>
            ((shared_ptr<noise_texture> *)(local_23c + 4));
  std::make_shared<sphere,vec3,int,std::shared_ptr<lambertian>>
            ((vec3 *)local_218,(int *)&local_198,(shared_ptr<lambertian> *)local_23c);
  local_1a8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_218._0_8_;
  local_1a8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_;
  local_218._0_8_ = (element_type *)0x0;
  local_218._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  hittable_list::add((hittable_list *)(local_218 + 0x10),&local_1a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1a8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_218 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_230);
  local_198.aspect_ratio = 0.0;
  local_198.image_width = 0;
  local_198.samples_per_pixel = 0x40000000;
  local_198.max_depth = 0;
  local_198._20_4_ = 0;
  local_23c._0_4_ = 2;
  std::make_shared<lambertian,std::shared_ptr<noise_texture>&>
            ((shared_ptr<noise_texture> *)(local_23c + 4));
  std::make_shared<sphere,vec3,int,std::shared_ptr<lambertian>>
            ((vec3 *)local_218,(int *)&local_198,(shared_ptr<lambertian> *)local_23c);
  local_1b8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_218._0_8_;
  local_1b8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_;
  local_218._0_8_ = 0.0;
  local_218._8_8_ = 0.0;
  hittable_list::add((hittable_list *)(local_218 + 0x10),&local_1b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1b8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_218 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_230);
  local_198.focus_dist = 10.0;
  memset(&local_198.center,0,0xd8);
  local_198.aspect_ratio = 1.7777777777777777;
  local_198.image_width = 400;
  local_198.samples_per_pixel = 100;
  local_198.max_depth = 0x32;
  local_198.background.e[0] = 0.7;
  local_198.background.e[1] = 0.8;
  local_198.background.e[2] = 1.0;
  local_198.vfov = 20.0;
  local_198.lookfrom.e[0] = 13.0;
  local_198.lookfrom.e[1] = 2.0;
  local_198.lookfrom.e[2] = 3.0;
  local_198.lookat.e[0] = 0.0;
  local_198.lookat.e[1] = 0.0;
  local_198.lookat.e[2] = 0.0;
  local_198.vup.e[0] = 0.0;
  local_198.vup.e[1] = 1.0;
  local_198.vup.e[2] = 0.0;
  local_198.defocus_angle = 0.0;
  camera::render(&local_198,(hittable *)(local_218 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_220);
  hittable_list::~hittable_list((hittable_list *)(local_218 + 0x10));
  return;
}

Assistant:

void bouncing_spheres() {
    hittable_list world;

    auto checker = make_shared<checker_texture>(0.32, color(.2, .3, .1), color(.9, .9, .9));
    world.add(make_shared<sphere>(point3(0,-1000,0), 1000, make_shared<lambertian>(checker)));

    for (int a = -11; a < 11; a++) {
        for (int b = -11; b < 11; b++) {
            auto choose_mat = random_double();
            point3 center(a + 0.9*random_double(), 0.2, b + 0.9*random_double());

            if ((center - point3(4, 0.2, 0)).length() > 0.9) {
                shared_ptr<material> sphere_material;

                if (choose_mat < 0.8) {
                    // diffuse
                    auto albedo = color::random() * color::random();
                    sphere_material = make_shared<lambertian>(albedo);
                    auto center2 = center + vec3(0, random_double(0,.5), 0);
                    world.add(make_shared<sphere>(center, center2, 0.2, sphere_material));
                } else if (choose_mat < 0.95) {
                    // metal
                    auto albedo = color::random(0.5, 1);
                    auto fuzz = random_double(0, 0.5);
                    sphere_material = make_shared<metal>(albedo, fuzz);
                    world.add(make_shared<sphere>(center, 0.2, sphere_material));
                } else {
                    // glass
                    sphere_material = make_shared<dielectric>(1.5);
                    world.add(make_shared<sphere>(center, 0.2, sphere_material));
                }
            }
        }
    }

    auto material1 = make_shared<dielectric>(1.5);
    world.add(make_shared<sphere>(point3(0, 1, 0), 1.0, material1));

    auto material2 = make_shared<lambertian>(color(0.4, 0.2, 0.1));
    world.add(make_shared<sphere>(point3(-4, 1, 0), 1.0, material2));

    auto material3 = make_shared<metal>(color(0.7, 0.6, 0.5), 0.0);
    world.add(make_shared<sphere>(point3(4, 1, 0), 1.0, material3));

    world = hittable_list(make_shared<bvh_node>(world));

    camera cam;

    cam.aspect_ratio      = 16.0 / 9.0;
    cam.image_width       = 400;
    cam.samples_per_pixel = 100;
    cam.max_depth         = 50;
    cam.background        = color(0.70, 0.80, 1.00);

    cam.vfov     = 20;
    cam.lookfrom = point3(13,2,3);
    cam.lookat   = point3(0,0,0);
    cam.vup      = vec3(0,1,0);

    cam.defocus_angle = 0.6;
    cam.focus_dist    = 10.0;

    cam.render(world);
}